

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::ConstructComment_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmCustomCommandGenerator *ccg,
          char *default_comment)

{
  pointer pbVar1;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  pointer path;
  string local_50;
  
  pcVar2 = cmCustomCommandGenerator::GetComment(ccg);
  if (pcVar2 == (char *)0x0) {
    pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    if ((pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
      pbVar1 = (pvVar3->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (path = (pvVar3->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; path != pbVar1; path = path + 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        cmOutputConverter::MaybeRelativeToCurBinDir(&local_50,&this->super_cmOutputConverter,path);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
      }
      return __return_storage_ptr__;
    }
  }
  else {
    default_comment = cmCustomCommandGenerator::GetComment(ccg);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,default_comment,(allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::ConstructComment(
  cmCustomCommandGenerator const& ccg, const char* default_comment) const
{
  // Check for a comment provided with the command.
  if (ccg.GetComment()) {
    return ccg.GetComment();
  }

  // Construct a reasonable default comment if possible.
  if (!ccg.GetOutputs().empty()) {
    std::string comment;
    comment = "Generating ";
    const char* sep = "";
    for (std::string const& o : ccg.GetOutputs()) {
      comment += sep;
      comment += this->MaybeRelativeToCurBinDir(o);
      sep = ", ";
    }
    return comment;
  }

  // Otherwise use the provided default.
  return default_comment;
}